

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O3

size_t ZSTD_compressBlock_lazy_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  int *piVar1;
  BYTE *iEnd;
  uint uVar2;
  ZSTD_matchState_t *pZVar3;
  long lVar4;
  uint uVar5;
  size_t sVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  BYTE *pBVar10;
  BYTE *pBVar11;
  seqDef *psVar12;
  BYTE *ip;
  BYTE *pBVar13;
  U32 UVar14;
  int iVar15;
  int *piVar16;
  size_t sVar17;
  int *piVar18;
  ulong uVar19;
  int *ip_00;
  long lVar20;
  size_t offset2;
  U32 local_e0;
  U32 local_dc;
  size_t local_c0;
  BYTE *local_b8;
  BYTE *local_b0;
  BYTE *local_a8;
  uint local_9c;
  seqStore_t *local_98;
  BYTE *local_90;
  int *local_88;
  BYTE *local_80;
  ZSTD_matchState_t *local_78;
  U32 *local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  BYTE *local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  local_a8 = (ms->window).base;
  uVar2 = (ms->window).dictLimit;
  local_b8 = local_a8 + uVar2;
  local_dc = *rep;
  local_e0 = rep[1];
  pZVar3 = ms->dictMatchState;
  local_b0 = (pZVar3->window).nextSrc;
  local_80 = (pZVar3->window).base;
  local_50 = local_80 + (pZVar3->window).dictLimit;
  iVar15 = (int)local_b0;
  ms->nextToUpdate3 = ms->nextToUpdate;
  iEnd = (BYTE *)((long)src + srcSize);
  piVar1 = (int *)((long)src + (srcSize - 8));
  piVar16 = (int *)((ulong)(((int)src - (int)local_b8) + iVar15 == (int)local_50) + (long)src);
  if (piVar16 < piVar1) {
    local_9c = ((int)local_80 - iVar15) + uVar2;
    local_90 = local_80 + -(ulong)local_9c;
    iVar8 = (int)local_a8;
    local_58 = (ulong)((1 - uVar2) - iVar8);
    local_60 = (ulong)(uint)-iVar8;
    local_68 = (ulong)((((iVar15 - uVar2) - (int)local_80) - iVar8) + 1);
    local_98 = seqStore;
    local_78 = ms;
    local_70 = rep;
    do {
      iVar15 = (int)piVar16;
      uVar5 = ((iVar15 - (int)local_a8) - local_dc) + 1;
      piVar18 = (int *)(local_a8 + uVar5);
      if (uVar5 < uVar2) {
        piVar18 = (int *)(local_80 + (uVar5 - local_9c));
      }
      if ((uVar5 - uVar2 < 0xfffffffd) && (*piVar18 == *(int *)((long)piVar16 + 1))) {
        pBVar10 = iEnd;
        if (uVar5 < uVar2) {
          pBVar10 = local_b0;
        }
        sVar6 = ZSTD_count_2segments
                          ((BYTE *)((long)piVar16 + 5),(BYTE *)(piVar18 + 1),iEnd,pBVar10,local_b8);
        uVar19 = sVar6 + 4;
      }
      else {
        uVar19 = 0;
      }
      local_c0 = 999999999;
      sVar6 = ZSTD_HcFindBestMatch_dictMatchState_selectMLS(local_78,(BYTE *)piVar16,iEnd,&local_c0)
      ;
      uVar7 = uVar19;
      if (uVar19 < sVar6) {
        uVar7 = sVar6;
      }
      if (uVar7 < 4) {
        piVar16 = (int *)((long)piVar16 + ((long)piVar16 - (long)src >> 8) + 1);
      }
      else {
        piVar18 = piVar16;
        sVar17 = local_c0;
        if (sVar6 <= uVar19) {
          piVar18 = (int *)((long)piVar16 + 1);
          sVar17 = 0;
        }
        uVar19 = uVar7;
        if (piVar16 < piVar1) {
          local_38 = (ulong)(((int)local_58 + iVar15) - local_dc);
          local_40 = (ulong)(((int)local_60 + iVar15) - local_dc);
          local_48 = (ulong)(((int)local_68 + iVar15) - local_dc);
          lVar20 = 0;
          local_88 = piVar16;
          do {
            ip_00 = (int *)((long)local_88 + lVar20 + 1);
            iVar15 = (int)lVar20;
            uVar5 = (int)local_40 + iVar15 + 1;
            piVar16 = (int *)(local_a8 + uVar5);
            if (uVar5 < uVar2) {
              piVar16 = (int *)(local_80 + (uint)((int)local_48 + iVar15));
            }
            uVar19 = uVar7;
            if (((uint)((int)local_38 + iVar15) < 0xfffffffd) && (*piVar16 == *ip_00)) {
              pBVar10 = iEnd;
              if (uVar5 < uVar2) {
                pBVar10 = local_b0;
              }
              sVar6 = ZSTD_count_2segments
                                ((BYTE *)((long)local_88 + lVar20 + 5),(BYTE *)(piVar16 + 1),iEnd,
                                 pBVar10,local_b8);
              if (sVar6 < 0xfffffffffffffffc) {
                uVar9 = (int)sVar17 + 1;
                uVar5 = 0x1f;
                if (uVar9 != 0) {
                  for (; uVar9 >> uVar5 == 0; uVar5 = uVar5 - 1) {
                  }
                }
                if ((int)((uVar5 ^ 0x1f) + (int)uVar7 * 3 + -0x1e) < (int)(sVar6 + 4) * 3) {
                  sVar17 = 0;
                  piVar18 = ip_00;
                  uVar19 = sVar6 + 4;
                }
              }
            }
            local_c0 = 999999999;
            uVar7 = ZSTD_HcFindBestMatch_dictMatchState_selectMLS
                              (local_78,(BYTE *)ip_00,iEnd,&local_c0);
            seqStore = local_98;
            if (uVar7 < 4) goto LAB_00461139;
            uVar9 = (int)sVar17 + 1;
            uVar5 = 0x1f;
            if (uVar9 != 0) {
              for (; uVar9 >> uVar5 == 0; uVar5 = uVar5 - 1) {
              }
            }
            uVar9 = (int)local_c0 + 1;
            iVar15 = 0x1f;
            if (uVar9 != 0) {
              for (; uVar9 >> iVar15 == 0; iVar15 = iVar15 + -1) {
              }
            }
            if ((int)uVar7 * 4 - iVar15 <= (int)((uVar5 ^ 0x1f) + (int)uVar19 * 4 + -0x1b))
            goto LAB_00461139;
            lVar4 = lVar20 + 1;
            lVar20 = lVar20 + 1;
            piVar18 = ip_00;
            sVar17 = local_c0;
          } while ((int *)((long)local_88 + lVar4) < piVar1);
          piVar18 = (int *)((long)local_88 + lVar20);
          uVar19 = uVar7;
        }
LAB_00461139:
        pBVar10 = local_a8;
        if (sVar17 == 0) {
          UVar14 = 1;
        }
        else {
          uVar7 = (long)piVar18 + (-(long)local_a8 - sVar17) + -0xfffffffe;
          pBVar11 = local_a8;
          pBVar13 = local_b8;
          if ((uint)uVar7 < uVar2) {
            pBVar11 = local_90;
            pBVar13 = local_50;
          }
          if ((src < piVar18) && (uVar7 = uVar7 & 0xffffffff, pBVar13 < pBVar11 + uVar7)) {
            pBVar11 = pBVar11 + uVar7;
            do {
              piVar16 = (int *)((long)piVar18 + -1);
              pBVar11 = pBVar11 + -1;
              if ((*(BYTE *)piVar16 != *pBVar11) ||
                 (uVar19 = uVar19 + 1, piVar18 = piVar16, piVar16 <= src)) break;
            } while (pBVar13 < pBVar11);
          }
          UVar14 = (int)sVar17 + 1;
          local_e0 = local_dc;
          local_dc = (int)sVar17 - 2;
        }
        uVar7 = (long)piVar18 - (long)src;
        pBVar11 = seqStore->lit;
        pBVar13 = pBVar11 + uVar7;
        do {
          *(undefined8 *)pBVar11 = *src;
          pBVar11 = pBVar11 + 8;
          src = (void *)((long)src + 8);
        } while (pBVar11 < pBVar13);
        seqStore->lit = seqStore->lit + uVar7;
        if (uVar7 < 0x10000) {
          psVar12 = seqStore->sequences;
        }
        else {
          seqStore->longLengthID = 1;
          psVar12 = seqStore->sequences;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar12 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar12->litLength = (U16)uVar7;
        psVar12->offset = UVar14;
        if (0xffff < uVar19 - 3) {
          seqStore->longLengthID = 2;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar12 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar12->matchLength = (U16)(uVar19 - 3);
        seqStore->sequences = psVar12 + 1;
        UVar14 = local_e0;
        for (piVar16 = (int *)((long)piVar18 + uVar19); local_e0 = UVar14, src = piVar16,
            piVar16 <= piVar1; piVar16 = (int *)((long)piVar16 + sVar6 + 4)) {
          uVar5 = ((int)piVar16 - (int)pBVar10) - local_e0;
          pBVar13 = pBVar10;
          if (uVar5 < uVar2) {
            pBVar13 = local_90;
          }
          if ((0xfffffffc < uVar5 - uVar2) || (*(int *)(pBVar13 + uVar5) != *piVar16)) break;
          pBVar11 = iEnd;
          if (uVar5 < uVar2) {
            pBVar11 = local_b0;
          }
          sVar6 = ZSTD_count_2segments
                            ((BYTE *)(piVar16 + 1),(BYTE *)((long)(pBVar13 + uVar5) + 4),iEnd,
                             pBVar11,local_b8);
          *(undefined8 *)seqStore->lit = *(undefined8 *)piVar16;
          psVar12 = seqStore->sequences;
          psVar12->litLength = 0;
          psVar12->offset = 1;
          if (0xffff < sVar6 + 1) {
            seqStore->longLengthID = 2;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar12 - (long)seqStore->sequencesStart) >> 3);
          }
          psVar12->matchLength = (U16)(sVar6 + 1);
          seqStore->sequences = psVar12 + 1;
          UVar14 = local_dc;
          local_dc = local_e0;
        }
      }
      rep = local_70;
    } while (piVar16 < piVar1);
  }
  *rep = local_dc;
  rep[1] = local_e0;
  return (long)iEnd - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_lazy_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, 0, 1, ZSTD_dictMatchState);
}